

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O3

int32 gauden_dist(gauden_t *g,int mgau,int32 n_top,mfcc_t **obs,gauden_dist_t **out_dist)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  gauden_dist_t *pgVar4;
  mfcc_t *pmVar5;
  mfcc_t **ppmVar6;
  mfcc_t **ppmVar7;
  mfcc_t *pmVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar17;
  undefined1 auVar16 [16];
  mfcc_t mVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  int iVar24;
  long lVar20;
  
  auVar11 = _DAT_00155b70;
  auVar10 = _DAT_00154950;
  auVar9 = _DAT_00154940;
  if ((n_top < 1) || (g->n_density < n_top)) {
    __assert_fail("(n_top > 0) && (n_top <= g->n_density)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x1f1,"int32 gauden_dist(gauden_t *, int, int32, mfcc_t **, gauden_dist_t **)");
  }
  iVar17 = g->n_feat;
  if (0 < iVar17) {
    lVar1 = (ulong)(uint)n_top - 1;
    auVar16._8_4_ = (int)lVar1;
    auVar16._0_8_ = lVar1;
    auVar16._12_4_ = (int)((ulong)lVar1 >> 0x20);
    lVar14 = 0;
    auVar16 = auVar16 ^ _DAT_00154950;
    do {
      pgVar4 = out_dist[lVar14];
      pmVar5 = obs[lVar14];
      uVar2 = g->featlen[lVar14];
      ppmVar6 = g->mean[mgau][lVar14];
      ppmVar7 = g->var[mgau][lVar14];
      pmVar8 = g->det[mgau][lVar14];
      uVar3 = g->n_density;
      if (n_top < (int)uVar3) {
        lVar12 = 0;
        auVar19 = auVar9;
        auVar21 = auVar11;
        do {
          auVar23 = auVar19 ^ auVar10;
          iVar17 = auVar16._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar17 && auVar16._0_4_ < auVar23._0_4_ ||
                      iVar17 < auVar23._4_4_) & 1)) {
            *(undefined4 *)((long)&pgVar4->dist + lVar12) = 0xcf000000;
          }
          if ((auVar23._12_4_ != auVar16._12_4_ || auVar23._8_4_ <= auVar16._8_4_) &&
              auVar23._12_4_ <= auVar16._12_4_) {
            *(undefined4 *)((long)&pgVar4[1].dist + lVar12) = 0xcf000000;
          }
          auVar23 = auVar21 ^ auVar10;
          iVar24 = auVar23._4_4_;
          if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar23._0_4_ <= auVar16._0_4_)) {
            *(undefined4 *)((long)&pgVar4[2].dist + lVar12) = 0xcf000000;
            *(undefined4 *)((long)&pgVar4[3].dist + lVar12) = 0xcf000000;
          }
          lVar20 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 4;
          auVar19._8_8_ = lVar20 + 4;
          lVar20 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 4;
          auVar21._8_8_ = lVar20 + 4;
          lVar12 = lVar12 + 0x20;
        } while ((ulong)(n_top + 3U >> 2) << 5 != lVar12);
        uVar13 = 0;
        do {
          mVar18 = pmVar8[uVar13];
          if (0 < (int)uVar2) {
            uVar15 = 0;
            do {
              if ((float)mVar18 < (float)pgVar4[n_top - 1U].dist) goto LAB_0015003a;
              fVar22 = (float)pmVar5[uVar15] - (float)ppmVar6[uVar13][uVar15];
              mVar18 = (mfcc_t)((float)mVar18 - fVar22 * fVar22 * (float)ppmVar7[uVar13][uVar15]);
              uVar15 = uVar15 + 1;
            } while (uVar2 != uVar15);
          }
          if ((float)pgVar4[n_top - 1U].dist <= (float)mVar18) {
            uVar15 = 0;
            while ((float)mVar18 < (float)pgVar4[uVar15].dist) {
              uVar15 = uVar15 + 1;
              if ((uint)n_top == uVar15) {
                __assert_fail("i < n_top",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                              ,0x1db,
                              "int32 compute_dist(gauden_dist_t *, int32, mfcc_t *, int32, mfcc_t **, mfcc_t **, mfcc_t *, int32)"
                             );
              }
            }
            lVar12 = lVar1;
            if ((int)uVar15 < (int)(n_top - 1U)) {
              do {
                pgVar4[lVar12] = pgVar4[lVar12 + -1];
                lVar12 = lVar12 + -1;
              } while ((long)uVar15 < lVar12);
            }
            pgVar4[uVar15].dist = mVar18;
            pgVar4[uVar15].id = (int32)uVar13;
          }
LAB_0015003a:
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar3);
        iVar17 = g->n_feat;
      }
      else if (0 < (int)uVar3) {
        uVar13 = 0;
        do {
          mVar18 = pmVar8[uVar13];
          if (0 < (int)uVar2) {
            uVar15 = 0;
            do {
              fVar22 = (float)pmVar5[uVar15] - (float)ppmVar6[uVar13][uVar15];
              mVar18 = (mfcc_t)((float)mVar18 - fVar22 * fVar22 * (float)ppmVar7[uVar13][uVar15]);
              uVar15 = uVar15 + 1;
            } while (uVar2 != uVar15);
          }
          pgVar4[uVar13].dist = mVar18;
          pgVar4[uVar13].id = (int32)uVar13;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar3);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar17);
  }
  return 0;
}

Assistant:

int32
gauden_dist(gauden_t * g,
            int mgau, int32 n_top, mfcc_t** obs, gauden_dist_t ** out_dist)
{
    int32 f;

    assert((n_top > 0) && (n_top <= g->n_density));

    for (f = 0; f < g->n_feat; f++) {
        compute_dist(out_dist[f], n_top,
                     obs[f], g->featlen[f],
                     g->mean[mgau][f], g->var[mgau][f], g->det[mgau][f],
                     g->n_density);
        E_DEBUG("Top CW(%d,%d) = %d %d\n", mgau, f, out_dist[f][0].id,
                (int)out_dist[f][0].dist >> SENSCR_SHIFT);
    }

    return 0;
}